

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O2

void AlphaVectorPruning::RemoveFirstOccurrence(ValueFunctionPOMDPDiscrete *V,AlphaVector *alpha)

{
  bool bVar1;
  const_iterator __position;
  
  __position._M_current =
       (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
       super__Vector_impl_data._M_start;
  while( true ) {
    if (__position._M_current ==
        (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    bVar1 = AlphaVector::Equal(alpha,__position._M_current);
    if (bVar1) break;
    __position._M_current = __position._M_current + 1;
  }
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::erase(V,__position);
  return;
}

Assistant:

void AlphaVectorPruning::RemoveFirstOccurrence(ValueFunctionPOMDPDiscrete &V,
                                               const AlphaVector &alpha)
{
    ValueFunctionPOMDPDiscrete::iterator it;
    for(it=V.begin();it!=V.end();++it)
        if(alpha.Equal(*it))
        {
            V.erase(it);
            return;
        }
}